

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * __thiscall
doctest::detail::
stringifyBinaryExpr<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (String *__return_storage_ptr__,detail *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lhs,char *op,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rhs)

{
  size_t sVar1;
  anon_union_24_2_13149d16_for_String_2 local_80;
  anon_union_24_2_13149d16_for_String_2 local_68;
  anon_union_24_2_13149d16_for_String_2 local_50;
  anon_union_24_2_13149d16_for_String_2 local_38;
  
  local_38._0_4_ = 0x7d3f7b;
  local_38.buf[0x17] = '\x14';
  sVar1 = strlen((char *)lhs);
  String::String((String *)&local_68.data,(char *)lhs,(uint)sVar1);
  operator+((String *)&local_80.data,(String *)&local_38.data,(String *)&local_68.data);
  local_50._0_4_ = 0x7d3f7b;
  local_50.buf[0x17] = '\x14';
  operator+(__return_storage_ptr__,(String *)&local_80.data,(String *)&local_50.data);
  if ((local_80.buf[0x17] < '\0') && (local_80.data.ptr != (char *)0x0)) {
    operator_delete__(local_80.data.ptr);
  }
  if ((local_68.buf[0x17] < '\0') && (local_68.data.ptr != (char *)0x0)) {
    operator_delete__(local_68.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }